

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeString::doExtract
          (UnicodeString *this,int32_t start,int32_t length,UChar *dst,int32_t dstStart)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  int iVar5;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  iVar5 = start;
  if (iVar2 < start) {
    iVar5 = iVar2;
  }
  if (start < 0) {
    iVar5 = 0;
  }
  iVar3 = iVar2 - iVar5;
  if (length <= iVar2 - iVar5) {
    iVar3 = length;
  }
  if (length < 0) {
    iVar3 = 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar4 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar4 = (char16_t *)((long)&this->fUnion + 2);
  }
  if ((pcVar4 + iVar5 != dst + dstStart) && (0 < iVar3)) {
    memmove(dst + dstStart,pcVar4 + iVar5,(ulong)(uint)(iVar3 * 2));
    return;
  }
  return;
}

Assistant:

void
UnicodeString::doExtract(int32_t start,
             int32_t length,
             UChar *dst,
             int32_t dstStart) const
{
  // pin indices to legal values
  pinIndices(start, length);

  // do not copy anything if we alias dst itself
  const UChar *array = getArrayStart();
  if(array + start != dst + dstStart) {
    us_arrayCopy(array, start, dst, dstStart, length);
  }
}